

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O1

string * __thiscall
Game::Graphics::GameInputControlsOverlay_abi_cxx11_
          (string *__return_storage_ptr__,Graphics *this,input_controls_display_data_t *gamestatus)

{
  Graphics GVar1;
  Graphics GVar2;
  ostringstream str_os;
  long *local_328;
  long local_320;
  long local_318 [2];
  ostringstream local_308 [112];
  ios_base local_298 [264];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  GVar1 = this[1];
  GVar2 = *this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (GVar2 == (Graphics)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_308);
    DrawAlways<std::__cxx11::string(*)()>((ostream *)local_308,InputCommandListPrompt_abi_cxx11_);
    if (GVar1 != (Graphics)0x0) {
      DrawAlways<std::__cxx11::string(*)()>
                ((ostream *)local_308,EndlessModeCommandListPrompt_abi_cxx11_);
    }
    DrawAlways<std::__cxx11::string(*)()>
              ((ostream *)local_308,InputCommandListFooterPrompt_abi_cxx11_);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_308);
    std::ios_base::~ios_base(local_298);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(char *)local_328,local_320);
    if (local_328 != local_318) {
      operator_delete(local_328,local_318[0] + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string GameInputControlsOverlay(input_controls_display_data_t gamestatus) {
  const auto is_in_endless_mode = std::get<0>(gamestatus);
  const auto is_in_question_mode = std::get<1>(gamestatus);
  std::ostringstream str_os;
  const auto InputControlLists = [=] {
    std::ostringstream str_os;
    DrawAlways(str_os, Graphics::InputCommandListPrompt);
    DrawOnlyWhen(str_os, is_in_endless_mode,
                 Graphics::EndlessModeCommandListPrompt);
    DrawAlways(str_os, Graphics::InputCommandListFooterPrompt);
    return str_os.str();
  };
  // When game is paused to ask a question, hide regular inut prompts..
  DrawOnlyWhen(str_os, !is_in_question_mode, InputControlLists);
  return str_os.str();
}